

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::previous(BreakCache *this,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t initialBufIdx;
  UErrorCode *status_local;
  BreakCache *this_local;
  
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    iVar1 = this->fBufIdx;
    if (this->fBufIdx == this->fStartBufIdx) {
      populatePreceding(this,status);
    }
    else {
      iVar3 = modChunkSize(this->fBufIdx + -1);
      this->fBufIdx = iVar3;
      this->fTextIdx = this->fBoundaries[this->fBufIdx];
    }
    this->fBI->fDone = this->fBufIdx == iVar1;
    this->fBI->fPosition = this->fTextIdx;
    this->fBI->fRuleStatusIndex = (uint)this->fStatuses[this->fBufIdx];
  }
  return;
}

Assistant:

void RuleBasedBreakIterator::BreakCache::previous(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    int32_t initialBufIdx = fBufIdx;
    if (fBufIdx == fStartBufIdx) {
        // At start of cache. Prepend to it.
        populatePreceding(status);
    } else {
        // Cache already holds the next boundary
        fBufIdx = modChunkSize(fBufIdx - 1);
        fTextIdx = fBoundaries[fBufIdx];
    }
    fBI->fDone = (fBufIdx == initialBufIdx);
    fBI->fPosition = fTextIdx;
    fBI->fRuleStatusIndex = fStatuses[fBufIdx];
    return;
}